

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locks.cc
# Opt level: O1

int __thiscall locks::checkList(locks *this,int seed)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if ((long)this->numberOfKeys < 1) {
    this->keyList[0] = seed;
    this->keyIndex = 1;
    this->numberOfKeys = 1;
LAB_00104d14:
    this->lastLockMatchedIndex = -1;
    iVar3 = 2;
  }
  else {
    lVar2 = 0;
    do {
      if (this->keyList[lVar2] == seed) goto LAB_00104d14;
      lVar2 = lVar2 + 1;
    } while (this->numberOfKeys != lVar2);
    this->keyList[this->keyIndex] = seed;
    iVar1 = this->keyIndex + 1;
    iVar3 = 0;
    if (iVar1 != 1000) {
      iVar3 = iVar1;
    }
    this->keyIndex = iVar3;
    iVar3 = 1;
    if (this->numberOfKeys < 1000) {
      this->numberOfKeys = this->numberOfKeys + 1;
      return 1;
    }
  }
  return iVar3;
}

Assistant:

int locks::checkList(int seed) {
  bool found = false;
  int returnCode = 1;  // it was good coming in by default
  if (numberOfKeys > 0) {
    for (int index = 0; index < numberOfKeys; index++) {
      if (seed == keyList[index]) {
        found = true;  // this is a recent repeat
        if (debug) {
          fprintf(stdout, "found %8.8x\n", seed);
        }
        break;
      }
    }
    if (!found) {  // put this key in the list
      if (debug) {
        fprintf(stdout, "Putting seed (%8.8x) into list\n", seed);
      }
      keyList[keyIndex] = seed;
      keyIndex++;
      if (keyIndex == OLD_KEY_LIST_SIZE) {
        keyIndex = 0;
      }
      if (numberOfKeys < OLD_KEY_LIST_SIZE) {
        numberOfKeys++;
      }
    } else {  // we have seen this before
      returnCode = 2;
      lastLockMatchedIndex = -1;  // say we didn't match
    }
  } else {
    if (debug) {
      fprintf(stdout, "First time forced failure with seed %8.8x\n", seed);
    }
    returnCode = 2;  // always fail the first time
    keyList[0] = seed;
    keyIndex = 1;
    numberOfKeys = 1;
    lastLockMatchedIndex = -1;  // say we didn't match
  }
  return returnCode;
}